

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  pointer *pppSVar1;
  uint32_t uVar2;
  int8_t *__src;
  IndexData *pIVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  undefined1 auVar4 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  uchar uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  uint uVar9;
  SubMesh *pSVar10;
  Logger *pLVar11;
  uint8_t *__dest;
  VertexData *this_01;
  runtime_error *this_02;
  char *pcVar12;
  StreamReader<false,_false> *this_03;
  ulong __n;
  bool bVar13;
  SubMesh *submesh;
  SubMesh *local_1d8;
  long *local_1d0;
  long local_1c0 [2];
  char *local_1b0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pSVar10 = (SubMesh *)operator_new(0xa8);
  SubMesh::SubMesh(pSVar10);
  local_1d8 = pSVar10;
  ReadLine_abi_cxx11_((string *)local_1a8,this);
  std::__cxx11::string::operator=
            ((string *)&(local_1d8->super_ISubMesh).materialRef,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  uVar6 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
  (local_1d8->super_ISubMesh).usesSharedVertexData = uVar6 != '\0';
  uVar9 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
  local_1d8->indexData->count = uVar9;
  local_1d8->indexData->faceCount = local_1d8->indexData->count / 3;
  uVar6 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
  local_1d8->indexData->is32bit = uVar6 != '\0';
  pLVar11 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [17])"Reading SubMesh ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar11,(char *)local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pLVar11 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [16])"  - Material: \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(local_1d8->super_ISubMesh).materialRef._M_dataplus._M_p,
             (local_1d8->super_ISubMesh).materialRef._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar11,(char *)local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pLVar11 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"  - Uses shared geometry: ");
  local_1b0 = "false";
  if ((local_1d8->super_ISubMesh).usesSharedVertexData != false) {
    local_1b0 = "true";
  }
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
             &local_1b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar11,(char *)local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar2 = local_1d8->indexData->count;
  if (uVar2 != 0) {
    __n = (ulong)(uVar2 << (local_1d8->indexData->is32bit + 1U & 0x1f));
    __dest = (uint8_t *)operator_new__(__n);
    __src = this->m_reader->current;
    StreamReader<false,_false>::SetPtr(this->m_reader,__src + __n);
    memcpy(__dest,__src,__n);
    local_1a8 = (undefined1  [8])Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (((MemoryIOStream *)local_1a8)->super_IOStream)._vptr_IOStream =
         (_func_int **)&PTR__MemoryIOStream_008ec190;
    ((MemoryIOStream *)local_1a8)->buffer = __dest;
    ((MemoryIOStream *)local_1a8)->length = __n;
    ((MemoryIOStream *)local_1a8)->pos = 0;
    ((MemoryIOStream *)local_1a8)->own = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::MemoryIOStream*>
              (&_Stack_1a0,(MemoryIOStream *)local_1a8);
    _Var5._M_pi = _Stack_1a0._M_pi;
    auVar4 = local_1a8;
    pIVar3 = local_1d8->indexData;
    local_1a8 = (undefined1  [8])0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pIVar3->buffer).
              super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pIVar3->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar4;
    (pIVar3->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [5])"  - ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," faces from ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    pcVar12 = " 16bit";
    if (local_1d8->indexData->is32bit != false) {
      pcVar12 = " 32bit";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," indexes of ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bytes",6);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar11,(char *)local_1d0);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((local_1d8->super_ISubMesh).usesSharedVertexData == false) {
    uVar7 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
    uVar9 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar9;
    if (uVar7 != 0x5000) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false","");
      std::runtime_error::runtime_error(this_02,(string *)local_1a8);
      *(undefined ***)this_02 = &PTR__runtime_error_008e3168;
      __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (VertexData *)operator_new(200);
    VertexData::VertexData(this_01);
    local_1d8->vertexData = this_01;
    ReadGeometry(this,this_01);
  }
  this_03 = this->m_reader;
  if (*(int *)&this_03->end == *(int *)&this_03->current) {
LAB_004799a7:
    NormalizeBoneWeights((OgreBinarySerializer *)this_03,local_1d8->vertexData);
    (local_1d8->super_ISubMesh).index =
         (uint)((ulong)((long)(mesh->subMeshes).
                              super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->subMeshes).
                             super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    __position._M_current =
         (mesh->subMeshes).
         super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (mesh->subMeshes).
        super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::SubMesh*,std::allocator<Assimp::Ogre::SubMesh*>>::
      _M_realloc_insert<Assimp::Ogre::SubMesh*const&>
                ((vector<Assimp::Ogre::SubMesh*,std::allocator<Assimp::Ogre::SubMesh*>> *)
                 &mesh->subMeshes,__position,&local_1d8);
    }
    else {
      *__position._M_current = local_1d8;
      pppSVar1 = &(mesh->subMeshes).
                  super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    return;
  }
  do {
    uVar7 = StreamReader<false,_false>::Get<unsigned_short>(this_03);
    uVar9 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar9;
    do {
      pSVar10 = local_1d8;
      this_03 = this->m_reader;
      bVar13 = *(int *)&this_03->end == *(int *)&this_03->current;
      if (bVar13) goto LAB_004799a7;
      if (uVar7 == 0x4200) {
        ReadSubMeshTextureAlias(this,local_1d8);
      }
      else if (uVar7 == 0x4100) {
        ReadBoneAssignment(this,local_1d8->vertexData);
      }
      else {
        if (uVar7 != 0x4010) {
          if (!bVar13) {
            StreamReader<false,_false>::IncPtr(this_03,-6);
          }
          goto LAB_004799a7;
        }
        uVar8 = StreamReader<false,_false>::Get<unsigned_short>(this_03);
        (pSVar10->super_ISubMesh).operationType = (uint)uVar8;
      }
      this_03 = this->m_reader;
    } while (*(int *)&this_03->end == *(int *)&this_03->current);
  } while( true );
}

Assistant:

void OgreBinarySerializer::ReadSubMesh(Mesh *mesh)
{
    uint16_t id = 0;

    SubMesh *submesh = new SubMesh();
    submesh->materialRef = ReadLine();
    submesh->usesSharedVertexData = Read<bool>();

    submesh->indexData->count = Read<uint32_t>();
    submesh->indexData->faceCount = static_cast<uint32_t>(submesh->indexData->count / 3);
    submesh->indexData->is32bit = Read<bool>();

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", submesh->usesSharedVertexData ? "true" : "false" );

    // Index buffer
    if (submesh->indexData->count > 0)
    {
        uint32_t numBytes = submesh->indexData->count * (submesh->indexData->is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
        uint8_t *indexBuffer = ReadBytes(numBytes);
        submesh->indexData->buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(indexBuffer, numBytes, true));

        ASSIMP_LOG_DEBUG_F( "  - ", submesh->indexData->faceCount,
            " faces from ", submesh->indexData->count, (submesh->indexData->is32bit ? " 32bit" : " 16bit"),
            " indexes of ", numBytes, " bytes");
    }

    // Vertex buffer if not referencing the shared geometry
    if (!submesh->usesSharedVertexData)
    {
        id = ReadHeader();
        if (id != M_GEOMETRY) {
            throw DeadlyImportError("M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false");
        }

        submesh->vertexData = new VertexData();
        ReadGeometry(submesh->vertexData);
    }

    // Bone assignment, submesh operation and texture aliases
    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() &&
            (id == M_SUBMESH_OPERATION ||
             id == M_SUBMESH_BONE_ASSIGNMENT ||
             id == M_SUBMESH_TEXTURE_ALIAS))
        {
            switch(id)
            {
                case M_SUBMESH_OPERATION:
                {
                    ReadSubMeshOperation(submesh);
                    break;
                }
                case M_SUBMESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(submesh->vertexData);
                    break;
                }
                case M_SUBMESH_TEXTURE_ALIAS:
                {
                    ReadSubMeshTextureAlias(submesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(submesh->vertexData);

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}